

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_helper.hpp
# Opt level: O1

void duckdb::ExtensionHelper::TryAutoloadFromEntry<16ul>
               (DatabaseInstance *db,string *entry,ExtensionEntry (*entries) [16])

{
  bool bVar1;
  DBConfig *pDVar2;
  ExtensionEntry (*in_RCX) [16];
  string extension_name;
  string local_40;
  
  pDVar2 = DBConfig::GetConfig(db);
  if ((pDVar2->options).autoload_known_extensions == true) {
    FindExtensionInEntries<16ul>(&local_40,(ExtensionHelper *)entry,(string *)entries,in_RCX);
    bVar1 = CanAutoloadExtension(&local_40);
    if (bVar1) {
      AutoLoadExtension(db,&local_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

static void TryAutoloadFromEntry(DatabaseInstance &db, const string &entry, const ExtensionEntry (&entries)[N]) {
		auto &dbconfig = DBConfig::GetConfig(db);
#ifndef DUCKDB_DISABLE_EXTENSION_LOAD
		if (dbconfig.options.autoload_known_extensions) {
			auto extension_name = ExtensionHelper::FindExtensionInEntries(entry, entries);
			if (ExtensionHelper::CanAutoloadExtension(extension_name)) {
				ExtensionHelper::AutoLoadExtension(db, extension_name);
			}
		}
#endif
	}